

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc.c
# Opt level: O1

int sexp_grow_heap(sexp_conflict ctx,size_t size,size_t chunk_size)

{
  size_t max_size;
  sexp_heap_conflict psVar1;
  sexp_heap_conflict psVar2;
  ulong uVar3;
  double dVar4;
  undefined1 auVar5 [16];
  
  psVar2 = (ctx->value).context.heap;
  do {
    psVar1 = psVar2;
    psVar2 = psVar1->next;
  } while (psVar1->next != (sexp_heap)0x0);
  if (size < psVar1->size) {
    size = psVar1->size;
  }
  max_size = psVar1->max_size;
  uVar3 = size + 0x1f & 0xffffffffffffffe0;
  auVar5._8_4_ = (int)(uVar3 >> 0x20);
  auVar5._0_8_ = uVar3;
  auVar5._12_4_ = 0x45300000;
  dVar4 = (auVar5._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0);
  dVar4 = ceil(dVar4 + dVar4);
  psVar2 = sexp_make_heap((long)(dVar4 - 9.223372036854776e+18) & (long)dVar4 >> 0x3f | (long)dVar4,
                          max_size,chunk_size);
  if (psVar2 != (sexp_heap_conflict)0x0) {
    psVar2->next = psVar1->next;
    psVar1->next = psVar2;
  }
  return (int)(psVar1->next != (sexp_heap)0x0);
}

Assistant:

int sexp_grow_heap (sexp ctx, size_t size, size_t chunk_size) {
  size_t cur_size, new_size;
  sexp_heap tmp, h = sexp_heap_last(sexp_context_heap(ctx));
#if SEXP_USE_FIXED_CHUNK_SIZE_HEAPS
  for (tmp=sexp_context_heap(ctx); tmp; tmp=tmp->next)
    if (tmp->chunk_size == size) {
      while (tmp->next && tmp->next->chunk_size == size)
        tmp = tmp->next;
      h = tmp;
      chunk_size = size;
      break;
    }
#endif
  cur_size = h->size;
  new_size = (size_t) ceil(SEXP_GROW_HEAP_FACTOR * (double) (sexp_heap_align(((cur_size > size) ? cur_size : size))));
  tmp = sexp_make_heap(new_size, h->max_size, chunk_size);
  if (tmp) {
    tmp->next = h->next;
    h->next = tmp;
  }
  return (h->next != NULL);
}